

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::ShapeAtomTypesSectionParser::parseShapeFile
          (ShapeAtomTypesSectionParser *this,ForceField *param_1,string *shapeFileName,AtomType *at)

{
  RealType RVar1;
  RealSphericalHarmonic *pRVar2;
  bool bVar3;
  int iVar4;
  ShapeAtomType *this_00;
  RealSphericalHarmonic *pRVar5;
  SimpleTypeData<OpenMD::ShapeAtomType_*> *this_01;
  allocator<char> aStack_104fa;
  allocator<char> aStack_104f9;
  RealSphericalHarmonic *rsh;
  string *psStack_104f0;
  vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  functionVector;
  DirectionalAdapter da;
  shared_ptr<OpenMD::GenericData> sStack_104a0;
  ShapeAtomType *st;
  string tempString;
  Mat3x3d I;
  StringTokenizer tokenInfo;
  string token;
  _Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  _Stack_103a8;
  _Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  _Stack_10390;
  _Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  _Stack_10378;
  string ffPath;
  ifstrstream shapeStream;
  RectMatrix<double,_3U,_3U> RStack_100c8;
  Mat3x3d momInert;
  char buffer [65535];
  
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  psStack_104f0 = shapeFileName;
  SquareMatrix<double,_3>::SquareMatrix(&momInert.super_SquareMatrix<double,_3>);
  functionVector.
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionVector.
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  functionVector.
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ifstrstream::ifstrstream(&shapeStream);
  tempString._M_dataplus._M_p = (pointer)&tempString.field_2;
  tempString._M_string_length = 0;
  tempString.field_2._M_local_buf[0] = '\0';
  ffPath._M_dataplus._M_p = (pointer)&ffPath.field_2;
  ffPath._M_string_length = 0;
  ffPath.field_2._M_local_buf[0] = '\0';
  getenv("FORCE_PARAM_PATH");
  std::__cxx11::string::assign((char *)&ffPath);
  ifstrstream::open(&shapeStream,(psStack_104f0->_M_dataplus)._M_p,8,0);
  bVar3 = ifstrstream::is_open(&shapeStream);
  if (!bVar3) {
    std::__cxx11::string::_M_assign((string *)&tempString);
    std::__cxx11::string::append((char *)&tempString);
    std::__cxx11::string::append((string *)&tempString);
    std::__cxx11::string::_M_assign((string *)psStack_104f0);
    ifstrstream::open(&shapeStream,(psStack_104f0->_M_dataplus)._M_p,8,0);
    bVar3 = ifstrstream::is_open(&shapeStream);
    if (!bVar3) {
      snprintf(painCave.errMsg,2000,
               "Error opening the shape file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
               ,(psStack_104f0->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  this_00 = (ShapeAtomType *)operator_new(0x48);
  (this_00->strengthFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->strengthFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->rangeFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->rangeFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->contactFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->rangeFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->contactFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->contactFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->strengthFuncs).
  super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  st = this_00;
  findBegin(&shapeStream.super_basic_istream<char,_std::char_traits<char>_>,"ShapeInfo");
  std::istream::getline((char *)&shapeStream,(long)buffer);
  while (((&shapeStream.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
          [(long)shapeStream.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream
                 [-3]] & 2) == 0) {
    if ((buffer[0] & 0xfdU) != 0x21) {
      iVar4 = isEndLine(buffer);
      if (iVar4 != 0) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&I,buffer,&aStack_104f9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&da," ;\t\n\r",&aStack_104fa);
      StringTokenizer::StringTokenizer(&tokenInfo,(string *)&I,(string *)&da);
      std::__cxx11::string::~string((string *)&da);
      std::__cxx11::string::~string((string *)&I);
      iVar4 = StringTokenizer::countTokens(&tokenInfo);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&tokenInfo);
        if (iVar4 < 5) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a ShapeInfo line in file: %s\n"
                   ,(psStack_104f0->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          StringTokenizer::skipToken(&tokenInfo);
          RVar1 = StringTokenizer::nextTokenAsDouble(&tokenInfo);
          AtomType::setMass(at,RVar1);
          da.at_ = at;
          SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&I);
          I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
               StringTokenizer::nextTokenAsDouble(&tokenInfo);
          I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
               StringTokenizer::nextTokenAsDouble(&tokenInfo);
          I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
               StringTokenizer::nextTokenAsDouble(&tokenInfo);
          RectMatrix<double,_3U,_3U>::operator=(&RStack_100c8,(RectMatrix<double,_3U,_3U> *)&I);
          DirectionalAdapter::makeDirectional(&da,(Mat3x3d *)&RStack_100c8);
        }
      }
      StringTokenizer::~StringTokenizer(&tokenInfo);
    }
    std::istream::getline((char *)&shapeStream,(long)buffer);
  }
  findBegin(&shapeStream.super_basic_istream<char,_std::char_traits<char>_>,"ContactFunctions");
  if (functionVector.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      functionVector.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    functionVector.
    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         functionVector.
         super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::istream::getline((char *)&shapeStream,(long)buffer);
  while (((&shapeStream.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
          [(long)shapeStream.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream
                 [-3]] & 2) == 0) {
    if ((buffer[0] & 0xfdU) != 0x21) {
      iVar4 = isEndLine(buffer);
      if (iVar4 != 0) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&I,buffer,&aStack_104f9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&da," ;\t\n\r",&aStack_104fa);
      StringTokenizer::StringTokenizer(&tokenInfo,(string *)&I,(string *)&da);
      std::__cxx11::string::~string((string *)&da);
      std::__cxx11::string::~string((string *)&I);
      iVar4 = StringTokenizer::countTokens(&tokenInfo);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&tokenInfo);
        if (iVar4 < 4) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a ContactFunctions line in file: %s\n"
                   ,(psStack_104f0->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          pRVar5 = (RealSphericalHarmonic *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic(pRVar5);
          rsh = pRVar5;
          iVar4 = StringTokenizer::nextTokenAsInt(&tokenInfo);
          pRVar2 = rsh;
          pRVar5->L = iVar4;
          iVar4 = StringTokenizer::nextTokenAsInt(&tokenInfo);
          pRVar2->M = iVar4;
          StringTokenizer::nextToken_abi_cxx11_((string *)&I,&tokenInfo);
          std::__cxx11::string::operator=((string *)&token,(string *)&I);
          std::__cxx11::string::~string((string *)&I);
          std::locale::locale((locale *)&I);
          toLower<std::__cxx11::string>(&token,(locale *)&I);
          std::locale::~locale((locale *)&I);
          bVar3 = std::operator==(&token,"sin");
          pRVar2 = rsh;
          rsh->functionType = (ushort)!bVar3;
          RVar1 = StringTokenizer::nextTokenAsDouble(&tokenInfo);
          pRVar2->coefficient = RVar1;
          std::
          vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          ::push_back(&functionVector,&rsh);
        }
      }
      StringTokenizer::~StringTokenizer(&tokenInfo);
    }
    std::istream::getline((char *)&shapeStream,(long)buffer);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)&_Stack_10378,&functionVector);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  operator=((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
             *)this_00,
            (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
             *)&_Stack_10378);
  std::
  _Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~_Vector_base(&_Stack_10378);
  findBegin(&shapeStream.super_basic_istream<char,_std::char_traits<char>_>,"RangeFunctions");
  if (functionVector.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      functionVector.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    functionVector.
    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         functionVector.
         super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::istream::getline((char *)&shapeStream,(long)buffer);
  while (((&shapeStream.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
          [(long)shapeStream.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream
                 [-3]] & 2) == 0) {
    if ((buffer[0] & 0xfdU) != 0x21) {
      iVar4 = isEndLine(buffer);
      if (iVar4 != 0) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&I,buffer,&aStack_104f9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&da," ;\t\n\r",&aStack_104fa);
      StringTokenizer::StringTokenizer(&tokenInfo,(string *)&I,(string *)&da);
      std::__cxx11::string::~string((string *)&da);
      std::__cxx11::string::~string((string *)&I);
      iVar4 = StringTokenizer::countTokens(&tokenInfo);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&tokenInfo);
        if (iVar4 < 4) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a RangeFunctions line in file: %s\n"
                   ,(psStack_104f0->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          pRVar5 = (RealSphericalHarmonic *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic(pRVar5);
          rsh = pRVar5;
          iVar4 = StringTokenizer::nextTokenAsInt(&tokenInfo);
          pRVar2 = rsh;
          pRVar5->L = iVar4;
          iVar4 = StringTokenizer::nextTokenAsInt(&tokenInfo);
          pRVar2->M = iVar4;
          StringTokenizer::nextToken_abi_cxx11_((string *)&I,&tokenInfo);
          std::__cxx11::string::operator=((string *)&token,(string *)&I);
          std::__cxx11::string::~string((string *)&I);
          std::locale::locale((locale *)&I);
          toLower<std::__cxx11::string>(&token,(locale *)&I);
          std::locale::~locale((locale *)&I);
          bVar3 = std::operator==(&token,"sin");
          pRVar2 = rsh;
          rsh->functionType = (ushort)!bVar3;
          RVar1 = StringTokenizer::nextTokenAsDouble(&tokenInfo);
          pRVar2->coefficient = RVar1;
          std::
          vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          ::push_back(&functionVector,&rsh);
        }
      }
      StringTokenizer::~StringTokenizer(&tokenInfo);
    }
    std::istream::getline((char *)&shapeStream,(long)buffer);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)&_Stack_10390,&functionVector);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  operator=(&this_00->rangeFuncs,
            (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
             *)&_Stack_10390);
  std::
  _Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~_Vector_base(&_Stack_10390);
  findBegin(&shapeStream.super_basic_istream<char,_std::char_traits<char>_>,"StrengthFunctions");
  if (functionVector.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      functionVector.
      super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    functionVector.
    super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         functionVector.
         super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::istream::getline((char *)&shapeStream,(long)buffer);
  while (((&shapeStream.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
          [(long)shapeStream.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream
                 [-3]] & 2) == 0) {
    if ((buffer[0] & 0xfdU) != 0x21) {
      iVar4 = isEndLine(buffer);
      if (iVar4 != 0) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&I,buffer,&aStack_104f9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&da," ;\t\n\r",&aStack_104fa);
      StringTokenizer::StringTokenizer(&tokenInfo,(string *)&I,(string *)&da);
      std::__cxx11::string::~string((string *)&da);
      std::__cxx11::string::~string((string *)&I);
      iVar4 = StringTokenizer::countTokens(&tokenInfo);
      if (iVar4 != 0) {
        iVar4 = StringTokenizer::countTokens(&tokenInfo);
        if (iVar4 < 4) {
          snprintf(painCave.errMsg,2000,
                   "ShapesAtomTypesSectionParser Error: Not enough information on a StrengthFunctions line in file: %s\n"
                   ,(psStack_104f0->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          pRVar5 = (RealSphericalHarmonic *)operator_new(0x20);
          RealSphericalHarmonic::RealSphericalHarmonic(pRVar5);
          rsh = pRVar5;
          iVar4 = StringTokenizer::nextTokenAsInt(&tokenInfo);
          pRVar2 = rsh;
          pRVar5->L = iVar4;
          iVar4 = StringTokenizer::nextTokenAsInt(&tokenInfo);
          pRVar2->M = iVar4;
          StringTokenizer::nextToken_abi_cxx11_((string *)&I,&tokenInfo);
          std::__cxx11::string::operator=((string *)&token,(string *)&I);
          std::__cxx11::string::~string((string *)&I);
          std::locale::locale((locale *)&I);
          toLower<std::__cxx11::string>(&token,(locale *)&I);
          std::locale::~locale((locale *)&I);
          bVar3 = std::operator==(&token,"sin");
          pRVar2 = rsh;
          rsh->functionType = (ushort)!bVar3;
          RVar1 = StringTokenizer::nextTokenAsDouble(&tokenInfo);
          pRVar2->coefficient = RVar1;
          std::
          vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          ::push_back(&functionVector,&rsh);
        }
      }
      StringTokenizer::~StringTokenizer(&tokenInfo);
    }
    std::istream::getline((char *)&shapeStream,(long)buffer);
  }
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  vector((vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
          *)&_Stack_103a8,&functionVector);
  std::vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  operator=(&this_00->strengthFuncs,
            (vector<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
             *)&_Stack_103a8);
  std::
  _Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~_Vector_base(&_Stack_103a8);
  this_01 = (SimpleTypeData<OpenMD::ShapeAtomType_*> *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tokenInfo,"Shape",(allocator<char> *)&I);
  SimpleTypeData<OpenMD::ShapeAtomType_*>::SimpleTypeData(this_01,&tokenInfo.tokenString_,&st);
  std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<OpenMD::SimpleTypeData<OpenMD::ShapeAtomType*>,void>
            ((__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> *)&sStack_104a0,this_01);
  AtomType::addProperty(at,&sStack_104a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_104a0.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&tokenInfo);
  std::__cxx11::string::~string((string *)&ffPath);
  std::__cxx11::string::~string((string *)&tempString);
  ifstrstream::~ifstrstream(&shapeStream);
  std::
  _Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>::
  ~_Vector_base(&functionVector.
                 super__Vector_base<OpenMD::RealSphericalHarmonic_*,_std::allocator<OpenMD::RealSphericalHarmonic_*>_>
               );
  std::__cxx11::string::~string((string *)&token);
  return;
}

Assistant:

void ShapeAtomTypesSectionParser::parseShapeFile(ForceField&,
                                                   std::string& shapeFileName,
                                                   AtomType* at) {
    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string token;

    Mat3x3d momInert;
    RealSphericalHarmonic* rsh;
    std::vector<RealSphericalHarmonic*> functionVector;
    ifstrstream shapeStream;
    std::string tempString;
    std::string ffPath;
    char* tempPath;

    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(ffPath, FRC_PATH);
    } else {
      ffPath = tempPath;
    }

    shapeStream.open(shapeFileName.c_str());

    if (!shapeStream.is_open()) {
      tempString = ffPath;
      tempString += "/";
      tempString += shapeFileName;
      shapeFileName = tempString;

      shapeStream.open(shapeFileName.c_str());

      if (!shapeStream.is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the shape file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 shapeFileName.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    ShapeAtomType* st = new ShapeAtomType();

    // first parse the info. in the ShapeInfo section
    findBegin(shapeStream, "ShapeInfo");
    shapeStream.getline(buffer, bufferSize);

    // loop over the interior of the ShapeInfo section
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo(buffer);
        // blank lines are ignored
        if (tokenInfo.countTokens() != 0) {
          if (tokenInfo.countTokens() < 5) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a ShapeInfo line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            tokenInfo.skipToken();
            at->setMass(tokenInfo.nextTokenAsDouble());
            DirectionalAdapter da = DirectionalAdapter(at);
            Mat3x3d I;
            I(0, 0) = tokenInfo.nextTokenAsDouble();
            I(1, 1) = tokenInfo.nextTokenAsDouble();
            I(2, 2) = tokenInfo.nextTokenAsDouble();
            da.makeDirectional(I);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // now grab the contact functions
    findBegin(shapeStream, "ContactFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo1(buffer);
        // blank lines are ignored
        if (tokenInfo1.countTokens() != 0) {
          if (tokenInfo1.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a ContactFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo1.nextTokenAsInt());
            rsh->setM(tokenInfo1.nextTokenAsInt());
            token = tokenInfo1.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo1.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass contact functions to ShapeType
    st->setContactFuncs(functionVector);

    // now grab the range functions
    findBegin(shapeStream, "RangeFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo2(buffer);
        // blank lines are ignored
        if (tokenInfo2.countTokens() != 0) {
          if (tokenInfo2.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a RangeFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo2.nextTokenAsInt());
            rsh->setM(tokenInfo2.nextTokenAsInt());
            token = tokenInfo2.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo2.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass range functions to ShapeType
    st->setRangeFuncs(functionVector);

    // finally grab the strength functions
    findBegin(shapeStream, "StrengthFunctions");
    functionVector.clear();

    shapeStream.getline(buffer, bufferSize);
    while (!shapeStream.eof()) {
      // toss comment lines
      if (buffer[0] != '!' && buffer[0] != '#') {
        // end marks section completion
        if (isEndLine(buffer)) break;
        StringTokenizer tokenInfo3(buffer);
        // blank lines are ignored
        if (tokenInfo3.countTokens() != 0) {
          if (tokenInfo3.countTokens() < 4) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ShapesAtomTypesSectionParser Error: Not enough "
                     "information on a StrengthFunctions line in file: %s\n",
                     shapeFileName.c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            // read in a spherical harmonic function
            rsh = new RealSphericalHarmonic();
            rsh->setL(tokenInfo3.nextTokenAsInt());
            rsh->setM(tokenInfo3.nextTokenAsInt());
            token = tokenInfo3.nextToken();
            toLower(token);
            if (token == "sin")
              rsh->makeSinFunction();
            else
              rsh->makeCosFunction();
            rsh->setCoefficient(tokenInfo3.nextTokenAsDouble());

            functionVector.push_back(rsh);
          }
        }
      }
      shapeStream.getline(buffer, bufferSize);
    }

    // pass strength functions to ShapeType
    st->setStrengthFuncs(functionVector);
    at->addProperty(
        std::shared_ptr<GenericData>(new ShapeAtypeData("Shape", st)));
    //  delete shapeStream;
  }